

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerLdWasmFunc(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  byte scale_00;
  bool bVar3;
  uint32 uVar4;
  int32 iVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  Opnd *dst_00;
  IndirOpnd *compareSrc2;
  IndirOpnd *src;
  undefined4 *puVar8;
  RegOpnd *indexOpnd_00;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *target_01;
  IntConstOpnd *pIVar9;
  LabelInstr *doneLabel;
  LabelInstr *trapLabel;
  LabelInstr *trapOutOfBoundsLabel;
  IndirOpnd *funcIndirOpnd;
  byte scale;
  RegOpnd *valuesRegOpnd;
  IndirOpnd *valuesIndirOpnd;
  IndirOpnd *lengthOpnd;
  Opnd *dst;
  Opnd *indexOpnd;
  RegOpnd *tableReg;
  Instr *prev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  pOVar6 = IR::Instr::UnlinkSrc1(instr);
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  dst_00 = IR::Instr::UnlinkDst(instr);
  uVar4 = Js::WebAssemblyTable::GetOffsetOfCurrentLength();
  compareSrc2 = IR::IndirOpnd::New(pRVar7,uVar4,TyUint32,this->m_func,false);
  uVar4 = Js::WebAssemblyTable::GetOffsetOfValues();
  src = IR::IndirOpnd::New(pRVar7,uVar4,TyUint64,this->m_func,false);
  pRVar7 = IR::RegOpnd::New(TyUint64,this->m_func);
  scale_00 = LowererMD::GetDefaultIndirScale();
  bVar3 = IR::Opnd::IsIntConstOpnd(pOVar6);
  if (bVar3) {
    pIVar9 = IR::Opnd::AsIntConstOpnd(pOVar6);
    iVar5 = IR::IntConstOpnd::AsInt32(pIVar9);
    trapOutOfBoundsLabel =
         (LabelInstr *)
         IR::IndirOpnd::New(pRVar7,iVar5 << (scale_00 & 0x1f),TyUint64,this->m_func,false);
  }
  else {
    bVar3 = IR::Opnd::IsRegOpnd(pOVar6);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x21a7,"(indexOpnd->IsRegOpnd())","indexOpnd->IsRegOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    indexOpnd_00 = IR::Opnd::AsRegOpnd(pOVar6);
    trapOutOfBoundsLabel =
         (LabelInstr *)IR::IndirOpnd::New(pRVar7,indexOpnd_00,TyUint64,this->m_func);
    IR::IndirOpnd::SetScale((IndirOpnd *)trapOutOfBoundsLabel,scale_00);
  }
  target = InsertLabel(true,instr);
  target_00 = InsertLabel(true,&target->super_Instr);
  target_01 = InsertLabel(false,instr->m_next);
  InsertCompareBranch(this,pOVar6,&compareSrc2->super_Opnd,BrGe_A,true,target,
                      &target_00->super_Instr,false);
  InsertMove(&pRVar7->super_Opnd,&src->super_Opnd,&target_00->super_Instr,true);
  InsertMove(dst_00,(Opnd *)trapOutOfBoundsLabel,&target_00->super_Instr,true);
  pIVar9 = IR::IntConstOpnd::New(0,TyUint64,this->m_func,false);
  InsertCompareBranch(this,dst_00,&pIVar9->super_Opnd,BrEq_A,target_00,&target_00->super_Instr,false
                     );
  InsertBranch(Br,target_01,&target_00->super_Instr);
  pOVar6 = IR::IntConstOpnd::NewFromType(0x1b65,TyInt32,this->m_func);
  GenerateThrow(this,pOVar6,&target->super_Instr);
  pOVar6 = IR::IntConstOpnd::NewFromType(0x1b68,TyInt32,this->m_func);
  GenerateThrow(this,pOVar6,instr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdWasmFunc(IR::Instr* instr)
{
    IR::Instr * prev = instr->m_prev;

    IR::RegOpnd * tableReg = instr->UnlinkSrc1()->AsRegOpnd();

    IR::Opnd * indexOpnd = instr->UnlinkSrc2();
    IR::Opnd * dst = instr->UnlinkDst();

    IR::IndirOpnd * lengthOpnd = IR::IndirOpnd::New(tableReg, Js::WebAssemblyTable::GetOffsetOfCurrentLength(), TyUint32, m_func);
    IR::IndirOpnd * valuesIndirOpnd = IR::IndirOpnd::New(tableReg, Js::WebAssemblyTable::GetOffsetOfValues(), TyMachPtr, m_func);
    IR::RegOpnd * valuesRegOpnd = IR::RegOpnd::New(TyMachPtr, m_func);

    byte scale = m_lowererMD.GetDefaultIndirScale();
    IR::IndirOpnd * funcIndirOpnd;
    if (indexOpnd->IsIntConstOpnd())
    {
        funcIndirOpnd = IR::IndirOpnd::New(valuesRegOpnd, indexOpnd->AsIntConstOpnd()->AsInt32() << scale, TyMachPtr, m_func);
    }
    else
    {
        Assert(indexOpnd->IsRegOpnd());
        funcIndirOpnd = IR::IndirOpnd::New(valuesRegOpnd, indexOpnd->AsRegOpnd(), TyMachPtr, m_func);
        funcIndirOpnd->SetScale(scale);
    }

    IR::LabelInstr * trapOutOfBoundsLabel = InsertLabel(true, instr);
    IR::LabelInstr * trapLabel = InsertLabel(true, trapOutOfBoundsLabel);
    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    InsertCompareBranch(indexOpnd, lengthOpnd, Js::OpCode::BrGe_A, true, trapOutOfBoundsLabel, trapLabel);
    InsertMove(valuesRegOpnd, valuesIndirOpnd, trapLabel);

    InsertMove(dst, funcIndirOpnd, trapLabel);

    InsertCompareBranch(dst, IR::IntConstOpnd::New(0, TyMachPtr, m_func), Js::OpCode::BrEq_A, trapLabel, trapLabel);
    InsertBranch(Js::OpCode::Br, doneLabel, trapLabel);

    GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_NeedWebAssemblyFunc), TyInt32, m_func), trapOutOfBoundsLabel);
    GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_TableIndexOutOfRange), TyInt32, m_func), instr);

    instr->Remove();

    return prev;
}